

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O1

void packint(luaL_Buffer *b,lua_Unsigned n,int islittle,int size,int neg)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  
  pcVar1 = luaL_prepbuffsize(b,(long)size);
  iVar2 = 0;
  if (islittle == 0) {
    iVar2 = size + -1;
  }
  pcVar1[iVar2] = (char)n;
  if (1 < size) {
    iVar2 = size + -2;
    iVar3 = 1;
    do {
      iVar4 = iVar3;
      if (islittle == 0) {
        iVar4 = iVar2;
      }
      pcVar1[iVar4] = (char)(n >> 8);
      iVar3 = iVar3 + 1;
      bVar5 = iVar2 != 0;
      iVar2 = iVar2 + -1;
      n = n >> 8;
    } while (bVar5);
  }
  if (8 < size && neg != 0) {
    iVar3 = size + -9;
    iVar2 = 8;
    do {
      iVar4 = iVar2;
      if (islittle == 0) {
        iVar4 = iVar3;
      }
      pcVar1[iVar4] = -1;
      iVar2 = iVar2 + 1;
      bVar5 = iVar3 != 0;
      iVar3 = iVar3 + -1;
    } while (bVar5);
  }
  b->n = b->n + (long)size;
  return;
}

Assistant:

static void packint (luaL_Buffer *b, lua_Unsigned n,
                     int islittle, int size, int neg) {
  char *buff = luaL_prepbuffsize(b, size);
  int i;
  buff[islittle ? 0 : size - 1] = (char)(n & MC);  /* first byte */
  for (i = 1; i < size; i++) {
    n >>= NB;
    buff[islittle ? i : size - 1 - i] = (char)(n & MC);
  }
  if (neg && size > SZINT) {  /* negative number need sign extension? */
    for (i = SZINT; i < size; i++)  /* correct extra bytes */
      buff[islittle ? i : size - 1 - i] = (char)MC;
  }
  luaL_addsize(b, size);  /* add result to buffer */
}